

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

size_t final_depth(size_t eliminations)

{
  ulong uVar1;
  
  uVar1 = 0xffffffffffffffff;
  do {
    uVar1 = uVar1 + 1;
    if (0x1f < uVar1) break;
  } while (eliminations - 1 >> ((byte)uVar1 & 0x3f) != 0);
  if (0x1f < uVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"too many eliminations",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    uVar1 = 0x1f;
  }
  return uVar1;
}

Assistant:

size_t final_depth(size_t eliminations)
{
  eliminations--;
  for (size_t i = 0; i < 32; i++)
    if (eliminations >> i == 0)
      return i;
  cerr << "too many eliminations" << endl;
  return 31;
}